

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_length(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  operand local_a4;
  operand local_a0 [2];
  string local_98;
  string error;
  string lab_finish;
  string lab_start;
  
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&lab_start,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&lab_finish,psVar1,lab);
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_98,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)&error,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    local_98._M_dataplus._M_p._0_4_ = 5;
    local_a4 = R11;
    local_a0[0] = NUMBER;
    local_a0[1] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_98,&local_a4,local_a0,(int *)(local_a0 + 1));
    local_98._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_98,&error);
  }
  local_98._M_dataplus._M_p._0_4_ = 0x5c;
  local_a4 = R15;
  local_a0[0] = local_a4;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_98,&local_a4,local_a0);
  local_98._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_98,&lab_start);
  local_98._M_dataplus._M_p._0_4_ = 5;
  local_a4 = RCX;
  local_a0[0] = NUMBER;
  local_a0[1] = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_98,&local_a4,local_a0,(int *)(local_a0 + 1));
  local_98._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_98,&lab_finish);
  if (ops->safe_primitives == true) {
    jump_if_arg_is_not_block(code,RCX,R11,&error);
  }
  local_a4 = AH;
  local_a0[0] = RCX;
  local_a0[1] = 0x39;
  local_98._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_a4,local_a0,local_a0 + 1,(unsigned_long *)&local_98);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_pair(code,RCX,R11,&error);
  }
  local_98._M_dataplus._M_p._0_4_ = 0x2b;
  local_a4 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_98,&local_a4);
  local_98._M_dataplus._M_p._0_4_ = 0x40;
  local_a4 = RAX;
  local_a0[0] = MEM_RCX;
  local_a0[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_98,&local_a4,local_a0,(int *)(local_a0 + 1));
  local_98._M_dataplus._M_p._0_4_ = 0x40;
  local_a4 = RCX;
  local_a0[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_98,&local_a4,local_a0);
  local_98._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_98,&lab_start);
  local_98._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_98,&lab_finish);
  local_98._M_dataplus._M_p._0_4_ = 0x40;
  local_a4 = RAX;
  local_a0[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_98,&local_a4,local_a0);
  local_98._M_dataplus._M_p._0_4_ = 0x55;
  local_a4 = RAX;
  local_a0[0] = NUMBER;
  local_a0[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_98,&local_a4,local_a0,(int *)(local_a0 + 1));
  local_98._M_dataplus._M_p._0_4_ = 0x2c;
  local_a4 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_98,&local_a4);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_length_contract_violation);
  }
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&lab_finish);
  std::__cxx11::string::~string((string *)&lab_start);
  return;
}

Assistant:

void compile_length(asmcode& code, const compiler_options& ops)
  {
  auto lab_start = label_to_string(label++);
  auto lab_finish = label_to_string(label++);
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::XOR, asmcode::R15, asmcode::R15);
  code.add(asmcode::LABEL, lab_start);
  code.add(asmcode::CMP, asmcode::RCX, asmcode::NUMBER, nil);
  code.add(asmcode::JES, lab_finish);
  if (ops.safe_primitives)
    {
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_pair(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::INC, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX, CELLS(2));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::RAX);
  code.add(asmcode::JMPS, lab_start);
  code.add(asmcode::LABEL, lab_finish);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R15);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_length_contract_violation);
    }
  }